

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O2

unsigned_long bhf::StringTo<unsigned_long>(string *v,unsigned_long value)

{
  long lVar1;
  code *pcVar2;
  stringstream converter;
  stringstream local_198 [16];
  long local_188 [47];
  
  if (v->_M_string_length != 0) {
    lVar1 = std::__cxx11::string::rfind((char *)v,0x10e441);
    std::__cxx11::stringstream::stringstream(local_198);
    pcVar2 = std::hex;
    if (lVar1 == -1) {
      pcVar2 = std::dec;
    }
    (*pcVar2)((ostream *)local_188 + *(long *)(local_188[0] + -0x18));
    std::operator<<((ostream *)local_188,(string *)v);
    std::istream::_M_extract<unsigned_long>((ulong *)local_198);
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  return value;
}

Assistant:

T StringTo(const std::string& v, T value = {})
{
    if (v.size()) {
        const auto asHex = (v.npos != v.rfind("0x", 0));
        std::stringstream converter;
        converter << (asHex ? std::hex : std::dec) << v;
        converter >> value;
    }
    return value;
}